

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::createPoolTransientBitTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice device;
  DeviceInterface *vk;
  VkCommandPoolCreateInfo cmdPoolParams;
  allocator<char> local_79;
  string local_78;
  VkCommandPoolCreateInfo local_58;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_40;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_58.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_58.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_58.pNext = (void *)0x0;
  local_58.flags = 1;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_40,vk,device,&local_58,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Command Pool allocated correctly.",&local_79);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolTransientBitTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,						// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}